

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int32 smooth_mixw(float32 ****out_mixw,float32 ***mixw_acc_a,float32 ***mixw_acc_b,uint32 n_mixw,
                 uint32 n_feat,uint32 n_gau,model_def_t *mdef)

{
  float fVar1;
  uint n_ci_state;
  acmod_set_t *acmod_set;
  model_def_entry_t *pmVar2;
  float32 *pfVar3;
  float *pfVar4;
  bool bVar5;
  bool bVar6;
  uint32 uVar7;
  uint32 uVar8;
  acmod_id_t aVar9;
  cmd_ln_t *pcVar10;
  float64 *dnom;
  float64 *dnom_00;
  float64 *dnom_01;
  ulong uVar11;
  float64 *pfVar12;
  uint32 **ci_mixw;
  ulong uVar13;
  uint32 **n_tied;
  float32 **lambda;
  float64 **lambda_acc;
  long lVar14;
  uchar *converged;
  long lVar15;
  char *pcVar16;
  ulong uVar17;
  uint uVar18;
  uint32 *puVar19;
  uint32 *puVar20;
  uint n_cd_state;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  float cilambda;
  double dVar24;
  double dVar25;
  double dVar26;
  float64 fVar27;
  float fVar28;
  undefined8 in_stack_ffffffffffffff18;
  float32 ***pppfVar29;
  uint32 in_stack_ffffffffffffff30;
  uint local_38;
  
  pcVar10 = cmd_ln_get();
  dVar24 = cmd_ln_float_r(pcVar10,"-cilambda");
  acmod_set = mdef->acmod_set;
  uVar17 = (ulong)mdef->n_tied_state;
  dnom = (float64 *)
         __ckd_calloc__(uVar17,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                        ,0xca);
  dnom_00 = (float64 *)
            __ckd_calloc__(uVar17,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcb);
  dnom_01 = (float64 *)
            __ckd_calloc__(uVar17,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                           ,0xcc);
  for (uVar22 = 0; uVar22 != uVar17; uVar22 = uVar22 + 1) {
    dVar25 = 0.0;
    dVar26 = 0.0;
    for (uVar11 = 0; n_gau != uVar11; uVar11 = uVar11 + 1) {
      dVar25 = dVar25 + (double)(float)(*mixw_acc_b[uVar22])[uVar11];
      dVar26 = dVar26 + (double)(float)(*mixw_acc_a[uVar22])[uVar11];
    }
    if ((dVar26 <= 0.0) || (dVar25 <= 0.0)) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0xdc,"Tied state %u never observed in the training corpus\n",uVar22 & 0xffffffff);
      dnom_01[uVar22] = 0.0;
      dnom_00[uVar22] = 0.0;
      fVar27 = 0.0;
      pfVar12 = dnom;
    }
    else {
      dnom[uVar22] = (float64)(1.0 / dVar26);
      dnom_00[uVar22] = (float64)(1.0 / dVar25);
      fVar27 = (float64)(1.0 / (dVar25 + dVar26));
      pfVar12 = dnom_01;
    }
    pfVar12[uVar22] = fVar27;
  }
  cilambda = (float)dVar24;
  n_ci_state = mdef->n_tied_ci_state;
  uVar7 = mdef->n_tied_state;
  n_cd_state = uVar7 - n_ci_state;
  if (n_cd_state == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xe9,"Only CI states.\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0xea,"    CI PDF == %.2f * CI + %.2f * UNIFORM\n",(double)cilambda,
            1.0 - (double)cilambda);
    accum_3d(mixw_acc_a,mixw_acc_b,uVar7,n_feat,n_gau);
    interp_counts_3d_uniform(mixw_acc_a,0,uVar7,n_feat,n_gau,(float32)cilambda);
    *out_mixw = mixw_acc_a;
    ckd_free_3d(mixw_acc_b);
  }
  else {
    uVar18 = mdef->max_n_state;
    uVar22 = (ulong)uVar18;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0x105,"Interpolating %u CD states\n",(ulong)n_cd_state);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
            ,0x106,"%u states max/model\n",uVar22);
    uVar11 = (ulong)n_cd_state;
    uVar17 = (ulong)(uVar18 + 1);
    ci_mixw = (uint32 **)
              __ckd_calloc_2d__(uVar11,uVar17,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                ,0x109);
    for (uVar23 = 0; uVar23 != uVar11; uVar23 = uVar23 + 1) {
      for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
        ci_mixw[uVar23][uVar13] = 0xffffffff;
      }
    }
    n_tied = (uint32 **)
             __ckd_calloc_2d__(uVar11,uVar17,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                               ,0x10f);
    for (uVar23 = 0; uVar23 != uVar11; uVar23 = uVar23 + 1) {
      for (uVar13 = 0; uVar17 != uVar13; uVar13 = uVar13 + 1) {
        n_tied[uVar23][uVar13] = 0xffffffff;
      }
    }
    uVar7 = acmod_set_n_ci(acmod_set);
    uVar8 = acmod_set_n_acmod(acmod_set);
    pmVar2 = mdef->defn;
    for (uVar17 = (ulong)uVar7; uVar17 < uVar8; uVar17 = uVar17 + 1) {
      aVar9 = acmod_set_base_phone(acmod_set,(acmod_id_t)uVar17);
      for (uVar23 = 0; uVar23 < pmVar2[uVar17].n_state; uVar23 = uVar23 + 1) {
        uVar18 = pmVar2[uVar17].state[uVar23];
        if (uVar18 != 0xffffffff && n_ci_state <= uVar18) {
          uVar18 = uVar18 - n_ci_state;
          puVar19 = ci_mixw[uVar18];
          for (uVar13 = 0; uVar22 != uVar13; uVar13 = uVar13 + 1) {
            puVar20 = pmVar2[aVar9].state;
            if ((puVar19[uVar13] == 0xffffffff) || (puVar19[uVar13] == puVar20[uVar23]))
            goto LAB_00102f80;
          }
          puVar20 = pmVar2[aVar9].state;
          uVar13 = uVar22;
LAB_00102f80:
          if (puVar19[uVar13] == puVar20[uVar23]) {
            puVar19 = n_tied[uVar18];
            uVar7 = puVar19[uVar13] + 1;
          }
          else {
            puVar19[uVar13] = puVar20[uVar23];
            puVar19 = n_tied[uVar18];
            puVar19[uVar13] = 0;
            uVar7 = 1;
          }
          puVar19[uVar13] = uVar7;
        }
      }
    }
    lambda = (float32 **)
             __ckd_calloc_2d__(uVar11,3,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                               ,0x139);
    lambda_acc = (float64 **)
                 __ckd_calloc_2d__(uVar11,3,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                   ,0x13c);
    for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
      pfVar3 = lambda[uVar17];
      pfVar3[2] = 0.6;
      pfVar3[0] = 0.1;
      pfVar3[1] = 0.3;
    }
    pcVar10 = cmd_ln_get();
    lVar14 = cmd_ln_int_r(pcVar10,"-maxiter");
    converged = (uchar *)__ckd_calloc__(uVar11,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                                        ,0x148);
    bVar6 = false;
    uVar21 = 0;
    uVar18 = 0;
    while( true ) {
      local_38 = (uint)lVar14;
      if ((local_38 <= uVar21) || (bVar6)) break;
      compute_mixw_lambda(lambda,lambda_acc,converged,n_cd_state,n_ci_state,ci_mixw,mixw_acc_b,
                          mixw_acc_a,dnom,in_stack_ffffffffffffff30,n_feat,n_gau);
      pppfVar29 = mixw_acc_a;
      compute_mixw_lambda(lambda,lambda_acc,converged,n_cd_state,n_ci_state,ci_mixw,mixw_acc_a,
                          mixw_acc_b,dnom_00,in_stack_ffffffffffffff30,n_feat,n_gau);
      bVar6 = false;
      for (uVar17 = 0; uVar17 != uVar11; uVar17 = uVar17 + 1) {
        if (converged[uVar17] != '\x01') {
          pfVar12 = lambda_acc[uVar17];
          dVar24 = 0.0;
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            dVar24 = dVar24 + (double)pfVar12[lVar15];
          }
          if (dVar24 <= 1.199999978106707e-38) {
            pfVar3 = lambda[uVar17];
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              pfVar3[lVar15] = 0.33333334;
            }
          }
          else {
            pfVar3 = lambda[uVar17];
            bVar5 = true;
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              fVar1 = (float)pfVar3[lVar15];
              fVar28 = (float)((double)pfVar12[lVar15] * (1.0 / dVar24));
              pfVar3[lVar15] = (float32)fVar28;
              pfVar12[lVar15] = 0.0;
              if (0.0001 < ABS(fVar1 - fVar28)) {
                bVar5 = false;
              }
            }
            if (!bVar5) goto LAB_00103216;
          }
          converged[uVar17] = '\x01';
          uVar18 = uVar18 + 1;
          if (uVar18 == n_cd_state) {
            bVar6 = true;
          }
        }
LAB_00103216:
      }
      in_stack_ffffffffffffff18 = CONCAT44((int)((ulong)pppfVar29 >> 0x20),n_cd_state);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0x188,"%u:%u:%u\n",(ulong)uVar21,(ulong)uVar18,in_stack_ffffffffffffff18);
      uVar21 = uVar21 + 1;
    }
    if (!bVar6) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
              ,0x18d,"%u of %u states converged after %u iterations.\n",(ulong)uVar18,n_cd_state,
              CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),uVar21));
    }
    puts("SUMMARY\n");
    puts(" State  Count A   Count B    Total    CD    CI    UNI   Cnv");
    puts("------ --------- --------- --------- ----- ----- ------ ---");
    uVar17 = 0;
    while( true ) {
      if (uVar11 == uVar17) break;
      uVar22 = (ulong)(n_ci_state + (int)uVar17);
      pfVar4 = (float *)lambda[uVar17];
      pcVar16 = "y";
      if (converged[uVar17] == '\0') {
        pcVar16 = "n";
      }
      printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",
             -(ulong)(0.0 < (double)dnom[uVar22]) & (ulong)(1.0 / (double)dnom[uVar22]),
             -(ulong)(0.0 < (double)dnom_00[uVar22]) & (ulong)(1.0 / (double)dnom_00[uVar22]),
             -(ulong)(0.0 < (double)dnom_01[uVar22]) & (ulong)(1.0 / (double)dnom_01[uVar22]),
             (double)pfVar4[2],(double)pfVar4[1],(double)*pfVar4,uVar22,pcVar16);
      uVar17 = uVar17 + 1;
    }
    interp_mixw(out_mixw,mixw_acc_a,mixw_acc_b,dnom_01,lambda,(float32)cilambda,ci_mixw,n_tied,
                n_cd_state,n_ci_state,n_mixw,n_feat,n_gau);
  }
  return 0;
}

Assistant:

int32
smooth_mixw(float32 ****out_mixw,
	    
	    float32 ***mixw_acc_a,
	    float32 ***mixw_acc_b,

	    uint32 n_mixw,
	    uint32 n_feat,
	    uint32 n_gau,

	    model_def_t *mdef
	    )
{
    uint32 i, j, k;
    uint32 n_base, cd_start, n_phone;
    uint32 n_ci_state;
    uint32 n_cd_state;
    uint32 n_state;
    uint32 max_state_pm;
    float64 *dnom_a;
    float64 *dnom_b;
    float64 *dnom;
    float64 sum_a;
    float64 sum_b;
    float64 sum;
    float32 **lambda;
    float64 **lambda_acc;
    uint32 **ci_mixw;
    uint32 *ci_state;
    uint32 max_iter;
    uint32 tt;
    unsigned char *conv_flag;
    uint32 converged;
    uint32 state_converged;
    acmod_id_t base;
    uint32 iter;
    float64 norm;
    float32 prior_lambda;
    model_def_entry_t *defn;
    float32 cilambda = cmd_ln_float32("-cilambda");
    uint32 n_conv_state;
    uint32 **n_tied;
    acmod_set_t *acmod_set;

    acmod_set = mdef->acmod_set;

    /*
     * Compute normalization factors
     */
    n_state = mdef->n_tied_state;

    dnom_a = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom_b = (float64 *)ckd_calloc(n_state, sizeof(float64));
    dnom   = (float64 *)ckd_calloc(n_state, sizeof(float64));

    /* compute the count normalization factor for all tied states */
    for (i = 0; i < n_state; i++) {
	sum_a = sum_b = sum = 0;
	for (k = 0; k < n_gau; k++) {
	    sum_a += mixw_acc_a[i][0][k];
	    sum_b += mixw_acc_b[i][0][k];
	}

	if ((sum_a > 0) && (sum_b > 0)) {
	    dnom_a[i] = 1.0 / sum_a;
	    dnom_b[i] = 1.0 / sum_b;
	    dnom[i] = 1.0 / (sum_a + sum_b);
	}
	else {
	    E_WARN("Tied state %u never observed in the training corpus\n", i);
	    dnom_a[i] = dnom_b[i] = dnom[i] = 0.0;
	}
    }

    /*
     * Interpolate CI states
     */

    n_cd_state = mdef->n_tied_state - mdef->n_tied_ci_state;
    n_ci_state = mdef->n_tied_ci_state;

    if (n_cd_state == 0) {
	E_INFO("Only CI states.\n");
	E_INFO("    CI PDF == %.2f * CI + %.2f * UNIFORM\n", cilambda, (1.0 - cilambda));
    
	/* add together counts for context independent states */
	accum_3d(mixw_acc_a, mixw_acc_b,
		 n_ci_state,	/* run over n_ci_state states */
		 n_feat, n_gau);

	/* interpolate CI distributions with uniform distribution */
	interp_counts_3d_uniform(mixw_acc_a,
				 0,		/* start state */
				 n_ci_state,	/* run length */
				 n_feat, n_gau,
				 cilambda);

	*out_mixw = mixw_acc_a;
	
	ckd_free_3d((void ***)mixw_acc_b);
	
	return S3_SUCCESS;
    }

    /*
     * Interpolate all states
     */

    max_state_pm = mdef->max_n_state;

    E_INFO("Interpolating %u CD states\n", n_cd_state);
    E_INFO("%u states max/model\n", max_state_pm);
    
    ci_mixw = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				       sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    ci_mixw[i][j] = TYING_NO_ID;

    n_tied = (uint32 **)ckd_calloc_2d(n_cd_state, max_state_pm+1,
				      sizeof(uint32));
    for (i = 0; i < n_cd_state; i++)
	for (j = 0; j < max_state_pm+1; j++)
	    n_tied[i][j] = TYING_NO_ID;
    
    cd_start = n_base = acmod_set_n_ci(acmod_set);
    n_phone = acmod_set_n_acmod(acmod_set);

    defn = mdef->defn;
    
    /* for each cd state, find the id's of the associated ci states */
    for (i = cd_start; i < n_phone; i++) {
	base = acmod_set_base_phone(acmod_set, i);
	for (j = 0; j < defn[i].n_state; j++) {
	    if (defn[i].state[j] < n_ci_state) {
		/* This is a ci state, so skip it */

		continue;
	    }

	    if (defn[i].state[j] != TYING_NON_EMITTING) {
		tt = defn[i].state[j] - n_ci_state;

		ci_state = ci_mixw[tt];
		
		for (k = 0; (k < max_state_pm) && (ci_state[k] != TYING_NO_ID); k++) {
		    if (ci_state[k] == defn[base].state[j])
			break;	/* already on list */
		}

		if (ci_state[k] != defn[base].state[j]) {
		    /* not on list, so add */
		    ci_state[k] = defn[base].state[j];
		    n_tied[tt][k] = 0;
		}

		++n_tied[tt][k];	/* # of times CD and CI occur in same state position */
	    }
	}
    }
    
    lambda = (float32 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					sizeof(float32));
    /* storage is returned zeroed */
    lambda_acc = (float64 **)ckd_calloc_2d(n_cd_state, N_DIST_TYPE,
					   sizeof(float64));

    for (i = 0; i < n_cd_state; i++) {
	/* biased initialization should help generally well trained models
	 * converge faster */
	lambda[i][(int)DIST_CD] = 0.6f;
	lambda[i][(int)DIST_CI] = 0.3f;
	lambda[i][(int)DIST_UNIFORM] = 0.1f;
    }

    max_iter = cmd_ln_int32("-maxiter");

    conv_flag = (unsigned char *)ckd_calloc(n_cd_state, sizeof(unsigned char));

    for (iter = 0, converged = FALSE, n_conv_state = 0;
	 (iter < max_iter) && (!converged);
	 iter++) {

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_b,
			    mixw_acc_a,
			    dnom_a,
			    n_mixw, n_feat, n_gau);

	compute_mixw_lambda(lambda, lambda_acc, conv_flag,
			    n_cd_state, n_ci_state,
			    ci_mixw,
			    mixw_acc_a,
			    mixw_acc_b,
			    dnom_b,
			    n_mixw, n_feat, n_gau);

	/* update lambdas and check for convergence */
	for (i = 0; i < n_cd_state; i++) {

	    if (conv_flag[i] == TRUE)	/* don't update converged states */
		continue;

	    norm = 0.0;
	    for (j = 0; j < N_DIST_TYPE; j++) {
		norm += lambda_acc[i][j];
	    }

	    if (norm > MIN_IEEE_NORM_POS_FLOAT32) {
		norm = 1.0f / norm;

		for (j = 0, state_converged = TRUE; j < N_DIST_TYPE; j++) {
		    prior_lambda = lambda[i][j];
		    lambda[i][j] = lambda_acc[i][j] * norm;

		    lambda_acc[i][j] = 0.0;

		    if (fabs(prior_lambda - lambda[i][j]) > CON_TH) {
			state_converged = FALSE;
		    }
		}
		    
	    }
	    else {
		for (j = 0; j < N_DIST_TYPE; j++) {
		    lambda[i][j] = 1.0f / N_DIST_TYPE;
		}
		state_converged = TRUE;
	    }
		
	    if (state_converged) {
		conv_flag[i] = TRUE;
		++n_conv_state;
		if (n_conv_state == n_cd_state) {
		    converged = TRUE;
		}
	    }
	}

	E_INFO("%u:%u:%u\n", iter, n_conv_state, n_cd_state);
    }

    if (!converged) {
	E_WARN("%u of %u states converged after %u iterations.\n",
	       n_conv_state, n_cd_state, iter);

    }

    printf("SUMMARY\n\n");
    printf(" State  Count A   Count B    Total    CD    CI    UNI   Cnv\n");
    printf("------ --------- --------- --------- ----- ----- ------ ---\n");
    for (i = 0; i < n_cd_state; i++) {

	j = n_ci_state + i;	/* CD tied state id */

	printf("%6u %.3e %.3e %.3e %.3f %.3f %.3f %s\n",
	       j,
	       (dnom_a[j] > 0 ? 1.0 / dnom_a[j] : 0.0),	/* count of partition A tied state j */
	       (dnom_b[j] > 0 ? 1.0 / dnom_b[j] : 0.0),	/* count of partition B tied state j */
	       (dnom[j] > 0 ? 1.0 / dnom[j] : 0.0),	/* count of partition A+B tied state j */
	       lambda[i][DIST_CD],
	       lambda[i][DIST_CI],
	       lambda[i][DIST_UNIFORM],
	       (conv_flag[i] ? "y" : "n"));
    }
    
    interp_mixw(out_mixw,
		mixw_acc_a, mixw_acc_b, dnom,
		lambda, cilambda,
		ci_mixw, n_tied,
		n_cd_state, n_ci_state,
		n_mixw, n_feat, n_gau);

    return S3_SUCCESS;
}